

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_seqparm_ext(bitstream *str,h262_seqparm *seqparm)

{
  uint uVar1;
  uint val;
  uint size;
  uint size_00;
  int iVar2;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t vbvh;
  uint32_t brh;
  uint32_t vsh;
  uint32_t hsh;
  int local_4;
  
  val = in_RSI->dir >> 0xc;
  size = *(uint *)&in_RSI->field_0x4 >> 0xc;
  size_00 = (uint)in_RSI->bytesnum >> 0x12;
  uVar1 = in_RSI->bytesmax;
  iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
  if (iVar2 == 0) {
    iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
    if (iVar2 == 0) {
      iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
      if (iVar2 == 0) {
        iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
        if (iVar2 == 0) {
          iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
          if (iVar2 == 0) {
            iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
            if (iVar2 == 0) {
              iVar2 = vs_mark(in_RSI,val,size);
              if (iVar2 == 0) {
                iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
                if (iVar2 == 0) {
                  iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
                  if (iVar2 == 0) {
                    iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
                    if (iVar2 == 0) {
                      iVar2 = vs_u(in_RSI,(uint32_t *)CONCAT44(val,size),size_00);
                      if (iVar2 == 0) {
                        if (*in_RDI == 1) {
                          in_RSI[9].type = VS_H262;
                          in_RSI->dir = val << 0xc | in_RSI->dir;
                          *(uint *)&in_RSI->field_0x4 = size << 0xc | *(uint *)&in_RSI->field_0x4;
                          in_RSI->bytesnum = size_00 << 0x12 | in_RSI->bytesnum;
                          in_RSI->bytesmax = uVar1 & 0xfffffc00 | in_RSI->bytesmax;
                        }
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h262_seqparm_ext(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hsh = seqparm->horizontal_size >> 12;
	uint32_t vsh = seqparm->vertical_size >> 12;
	uint32_t brh = seqparm->bit_rate >> 18;
	uint32_t vbvh = seqparm->vbv_buffer_size >> 10;
	if (vs_u(str, &seqparm->profile_and_level_indication, 8)) return 1;
	if (vs_u(str, &seqparm->progressive_sequence, 1)) return 1;
	if (vs_u(str, &seqparm->chroma_format, 2)) return 1;
	if (vs_u(str, &hsh, 2)) return 1;
	if (vs_u(str, &vsh, 2)) return 1;
	if (vs_u(str, &brh, 12)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbvh, 8)) return 1;
	if (vs_u(str, &seqparm->low_delay, 1)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_n, 2)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_d, 5)) return 1;
	if (str->dir == VS_DECODE) {
		seqparm->is_ext = 1;
		seqparm->horizontal_size |= hsh << 12;
		seqparm->vertical_size |= vsh << 12;
		seqparm->bit_rate |= brh << 18;
		seqparm->vbv_buffer_size |= vbvh << 10;
	}
	return 0;
}